

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

void __thiscall
tchecker::typed_if_statement_t::typed_if_statement_t
          (typed_if_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_expression_t> *cond,
          shared_ptr<const_tchecker::typed_statement_t> *then_stmt,
          shared_ptr<const_tchecker::typed_statement_t> *else_stmt)

{
  shared_ptr<const_tchecker::statement_t> local_60;
  shared_ptr<const_tchecker::statement_t> local_50;
  shared_ptr<const_tchecker::expression_t> local_40;
  shared_ptr<const_tchecker::typed_statement_t> *local_30;
  shared_ptr<const_tchecker::typed_statement_t> *else_stmt_local;
  shared_ptr<const_tchecker::typed_statement_t> *then_stmt_local;
  shared_ptr<const_tchecker::typed_expression_t> *cond_local;
  typed_if_statement_t *ptStack_10;
  statement_type_t type_local;
  typed_if_statement_t *this_local;
  
  local_30 = else_stmt;
  else_stmt_local = then_stmt;
  then_stmt_local = (shared_ptr<const_tchecker::typed_statement_t> *)cond;
  cond_local._4_4_ = type;
  ptStack_10 = this;
  statement_t::statement_t((statement_t *)this);
  typed_statement_t::typed_statement_t
            (&this->super_typed_statement_t,&PTR_PTR_004850a0,cond_local._4_4_);
  std::shared_ptr<tchecker::expression_t_const>::shared_ptr<tchecker::typed_expression_t_const,void>
            ((shared_ptr<tchecker::expression_t_const> *)&local_40,
             (shared_ptr<const_tchecker::typed_expression_t> *)then_stmt_local);
  std::shared_ptr<tchecker::statement_t_const>::shared_ptr<tchecker::typed_statement_t_const,void>
            ((shared_ptr<tchecker::statement_t_const> *)&local_50,else_stmt_local);
  std::shared_ptr<tchecker::statement_t_const>::shared_ptr<tchecker::typed_statement_t_const,void>
            ((shared_ptr<tchecker::statement_t_const> *)&local_60,local_30);
  if_statement_t::if_statement_t
            (&this->super_if_statement_t,&PTR_construction_vtable_56__004850b0,&local_40,&local_50,
             &local_60);
  std::shared_ptr<const_tchecker::statement_t>::~shared_ptr(&local_60);
  std::shared_ptr<const_tchecker::statement_t>::~shared_ptr(&local_50);
  std::shared_ptr<const_tchecker::expression_t>::~shared_ptr(&local_40);
  *(undefined8 *)&this->super_typed_statement_t = 0x484ff8;
  *(undefined8 *)&this->super_typed_statement_t = 0x484ff8;
  *(undefined8 *)&this->super_if_statement_t = 0x485068;
  return;
}

Assistant:

typed_if_statement_t::typed_if_statement_t(enum tchecker::statement_type_t type,
                                           std::shared_ptr<tchecker::typed_expression_t const> const & cond,
                                           std::shared_ptr<tchecker::typed_statement_t const> const & then_stmt,
                                           std::shared_ptr<tchecker::typed_statement_t const> const & else_stmt)
    : tchecker::typed_statement_t(type), tchecker::if_statement_t(cond, then_stmt, else_stmt)
{
}